

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O2

int WriteLE(FILE *out,uint32_t val,int num)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  uint8_t buf [4];
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < num) {
    uVar3 = (ulong)(uint)num;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    buf[uVar1] = (uint8_t)val;
    val = val >> 8;
  }
  sVar2 = fwrite(buf,(ulong)(uint)num,1,(FILE *)out);
  return (int)(sVar2 == 1);
}

Assistant:

static int WriteLE(FILE* const out, uint32_t val, int num) {
  uint8_t buf[4];
  int i;
  for (i = 0; i < num; ++i) {
    buf[i] = (uint8_t)(val & 0xff);
    val >>= 8;
  }
  return (fwrite(buf, num, 1, out) == 1);
}